

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linkedlist_apply.c
# Opt level: O1

int test_linkedlist_apply(void)

{
  int iVar1;
  int iVar2;
  s_linkedlist *linked_list;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  
  linked_list = linkedlist_create();
  pcVar3 = strdup("apple");
  linkedlist_add_back(linked_list,pcVar3);
  pcVar3 = strdup("banana");
  linkedlist_add_back(linked_list,pcVar3);
  pcVar3 = strdup("clementine");
  linkedlist_add_back(linked_list,pcVar3);
  linkedlist_apply(linked_list,fun_applier_uppercase,(void *)0x0);
  bVar5 = linked_list->size != 3;
  pcVar3 = (char *)linkedlist_get(linked_list,0);
  iVar1 = strcmp_with_s2_nullcheck("APPLE",pcVar3);
  cVar4 = bVar5 + '\x01';
  if (iVar1 == 0) {
    cVar4 = bVar5;
  }
  pcVar3 = (char *)linkedlist_get(linked_list,1);
  iVar1 = strcmp_with_s2_nullcheck("BANANA",pcVar3);
  pcVar3 = (char *)linkedlist_get(linked_list,2);
  iVar2 = strcmp_with_s2_nullcheck("CLEMENTINE",pcVar3);
  linkedlist_destroy(linked_list,fun_free_memory);
  return (int)(iVar2 == 0 && (bool)(cVar4 + '\x01') == (iVar1 == 0));
}

Assistant:

int test_linkedlist_apply(void) {
    s_linkedlist *linked_list = NULL;
    unsigned int error        = 0;

    // Test
    linked_list = linkedlist_create();
    linkedlist_add_back(linked_list, strdup("apple"));
    linkedlist_add_back(linked_list, strdup("banana"));
    linkedlist_add_back(linked_list, strdup("clementine"));
    linkedlist_apply(linked_list, &fun_applier_uppercase, NULL);

    // Assert
    if (linked_list->size != 3) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("APPLE", linkedlist_get(linked_list, 0)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("BANANA", linkedlist_get(linked_list, 1)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("CLEMENTINE", linkedlist_get(linked_list, 2)) != 0) {
        error += 1;
    }

    // Free allocated memory
    linkedlist_destroy(linked_list, &fun_free_memory);

    return (error == 0);
}